

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O2

int Kit_TruthIsop(uint *puTruth,int nVars,Vec_Int_t *vMemory,int fTryBoth)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  Kit_Sop_t *pcRes;
  Kit_Sop_t cRes;
  Kit_Sop_t cRes2;
  
  if (0x10 < (uint)nVars) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x8c,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
  }
  vMemory->nSize = 0;
  Vec_IntGrow(vMemory,nVars);
  pcRes = &cRes;
  puVar3 = Kit_TruthIsop_rec(puTruth,puTruth,nVars,pcRes,vMemory);
  if (cRes.nCubes == -1) {
    vMemory->nSize = -1;
    iVar1 = -1;
  }
  else {
    iVar1 = Kit_TruthIsEqual(puTruth,puVar3,nVars);
    if (iVar1 == 0) {
      __assert_fail("Kit_TruthIsEqual( puTruth, pResult, nVars )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                    ,0x9a,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
    }
    if ((cRes.nCubes == 0) || ((cRes.nCubes == 1 && (*cRes.pCubes == 0)))) {
      *vMemory->pArray = 0;
      Vec_IntShrink(vMemory,cRes.nCubes);
      iVar1 = 0;
    }
    else {
      if (fTryBoth == 0) {
        iVar1 = 0;
      }
      else {
        Kit_TruthNot(puTruth,puTruth,nVars);
        puVar3 = Kit_TruthIsop_rec(puTruth,puTruth,nVars,&cRes2,vMemory);
        iVar1 = 0;
        pcRes = &cRes;
        if (-1 < cRes2.nCubes) {
          iVar2 = Kit_TruthIsEqual(puTruth,puVar3,nVars);
          if (iVar2 == 0) {
            __assert_fail("Kit_TruthIsEqual( puTruth, pResult, nVars )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                          ,0xa8,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
          }
          if ((cRes2.nCubes < cRes.nCubes) ||
             ((cRes.nCubes == cRes2.nCubes && (cRes2.nLits < cRes.nLits)))) {
            iVar1 = 1;
            pcRes = &cRes2;
          }
        }
        Kit_TruthNot(puTruth,puTruth,nVars);
        cRes.nCubes = pcRes->nCubes;
      }
      memmove(vMemory->pArray,pcRes->pCubes,(long)cRes.nCubes << 2);
      Vec_IntShrink(vMemory,pcRes->nCubes);
    }
  }
  return iVar1;
}

Assistant:

int Kit_TruthIsop( unsigned * puTruth, int nVars, Vec_Int_t * vMemory, int fTryBoth )
{
    Kit_Sop_t cRes, * pcRes = &cRes;
    Kit_Sop_t cRes2, * pcRes2 = &cRes2;
    unsigned * pResult;
    int RetValue = 0;
    assert( nVars >= 0 && nVars <= 16 );
    // if nVars < 5, make sure it does not depend on those vars
//    for ( i = nVars; i < 5; i++ )
//        assert( !Kit_TruthVarInSupport(puTruth, 5, i) );
    // prepare memory manager
    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_ISOP_MEM_LIMIT );
    // compute ISOP for the direct polarity
    pResult = Kit_TruthIsop_rec( puTruth, puTruth, nVars, pcRes, vMemory );
    if ( pcRes->nCubes == -1 )
    {
        vMemory->nSize = -1;
        return -1;
    }
    assert( Kit_TruthIsEqual( puTruth, pResult, nVars ) );
    if ( pcRes->nCubes == 0 || (pcRes->nCubes == 1 && pcRes->pCubes[0] == 0) )
    {
        vMemory->pArray[0] = 0;
        Vec_IntShrink( vMemory, pcRes->nCubes );
        return 0;
    }
    if ( fTryBoth )
    {
        // compute ISOP for the complemented polarity
        Kit_TruthNot( puTruth, puTruth, nVars );
        pResult = Kit_TruthIsop_rec( puTruth, puTruth, nVars, pcRes2, vMemory );
        if ( pcRes2->nCubes >= 0 )
        {
            assert( Kit_TruthIsEqual( puTruth, pResult, nVars ) );
            if ( pcRes->nCubes > pcRes2->nCubes || (pcRes->nCubes == pcRes2->nCubes && pcRes->nLits > pcRes2->nLits) )
            {
                RetValue = 1;
                pcRes = pcRes2;
            }
        }
        Kit_TruthNot( puTruth, puTruth, nVars );
    }
//    printf( "%d ", vMemory->nSize );
    // move the cover representation to the beginning of the memory buffer
    memmove( vMemory->pArray, pcRes->pCubes, pcRes->nCubes * sizeof(unsigned) );
    Vec_IntShrink( vMemory, pcRes->nCubes );
    return RetValue;
}